

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void hexFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  char *z;
  long lVar4;
  int iVar5;
  
  pvVar3 = sqlite3_value_blob(*argv);
  iVar2 = sqlite3_value_bytes(*argv);
  z = (char *)contextMalloc(context,(long)iVar2 * 2 + 1);
  if (z == (char *)0x0) {
    return;
  }
  lVar4 = 0;
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  for (; iVar5 != (int)lVar4; lVar4 = lVar4 + 1) {
    bVar1 = *(byte *)((long)pvVar3 + lVar4);
    z[lVar4 * 2] = "0123456789ABCDEF"[bVar1 >> 4];
    z[lVar4 * 2 + 1] = "0123456789ABCDEF"[bVar1 & 0xf];
  }
  z[lVar4 * 2] = '\0';
  sqlite3_result_text(context,z,iVar2 * 2,sqlite3_free);
  return;
}

Assistant:

static void hexFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i, n;
  const unsigned char *pBlob;
  char *zHex, *z;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  pBlob = sqlite3_value_blob(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  assert( pBlob==sqlite3_value_blob(argv[0]) );  /* No encoding change */
  z = zHex = contextMalloc(context, ((i64)n)*2 + 1);
  if( zHex ){
    for(i=0; i<n; i++, pBlob++){
      unsigned char c = *pBlob;
      *(z++) = hexdigits[(c>>4)&0xf];
      *(z++) = hexdigits[c&0xf];
    }
    *z = 0;
    sqlite3_result_text(context, zHex, n*2, sqlite3_free);
  }
}